

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOfPdu.cpp
# Opt level: O0

int __thiscall DIS::IsPartOfPdu::getMarshalledSize(IsPartOfPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int marshalSize;
  IsPartOfPdu *this_local;
  
  iVar1 = EntityManagementFamilyPdu::getMarshalledSize(&this->super_EntityManagementFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_orginatingEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar4 = Relationship::getMarshalledSize(&this->_relationship);
  iVar5 = Vector3Float::getMarshalledSize(&this->_partLocation);
  iVar6 = NamedLocationIdentification::getMarshalledSize(&this->_namedLocationID);
  iVar7 = EntityType::getMarshalledSize(&this->_partEntityType);
  return iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7;
}

Assistant:

int IsPartOfPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _orginatingEntityID.getMarshalledSize();  // _orginatingEntityID
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _relationship.getMarshalledSize();  // _relationship
   marshalSize = marshalSize + _partLocation.getMarshalledSize();  // _partLocation
   marshalSize = marshalSize + _namedLocationID.getMarshalledSize();  // _namedLocationID
   marshalSize = marshalSize + _partEntityType.getMarshalledSize();  // _partEntityType
    return marshalSize;
}